

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# property.cpp
# Opt level: O1

void __thiscall camp::Property::set(Property *this,UserObject *object,Value *value)

{
  element_type *peVar1;
  char cVar2;
  int iVar3;
  ForbiddenWrite *__return_storage_ptr__;
  string local_b0;
  string local_90;
  ForbiddenWrite local_70;
  
  iVar3 = (*(this->super_TagHolder)._vptr_TagHolder[6])();
  if ((char)iVar3 != '\0') {
    peVar1 = (this->m_writable).m_getter.
             super___shared_ptr<camp::detail::GetterInterface<bool>,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr;
    if (peVar1 == (element_type *)0x0) {
      cVar2 = (this->m_writable).m_defaultValue;
    }
    else {
      cVar2 = (**(code **)(*(long *)peVar1 + 0x10))(peVar1,object);
    }
    if (cVar2 != '\0') {
      UserObject::set(object,this,value);
      return;
    }
  }
  __return_storage_ptr__ = (ForbiddenWrite *)__cxa_allocate_exception(0x48);
  ForbiddenWrite::ForbiddenWrite(&local_70,&this->m_name);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_90,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/fw4spl-org[P]camp/src/property.cpp"
             ,"");
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_b0,"void camp::Property::set(const UserObject &, const Value &) const"
             ,"");
  Error::prepare<camp::ForbiddenWrite>(__return_storage_ptr__,&local_70,&local_90,0x53,&local_b0);
  __cxa_throw(__return_storage_ptr__,&ForbiddenWrite::typeinfo,Error::~Error);
}

Assistant:

void Property::set(const UserObject& object, const Value& value) const
{
    // Check if the property is writable
    if (!writable(object))
        CAMP_ERROR(ForbiddenWrite(name()));

    // Here we don't call setValue directly, we rather let the user object do it
    // and add any processing needed for proper propagation of the modification
    object.set(*this, value);
}